

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O2

particles * read_particles(char *charfilename)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  ostream *poVar3;
  particles *ppVar4;
  istream *piVar5;
  ulong uVar6;
  particle *ppVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  vector<double,_std::allocator<double>_> v;
  double a;
  string filename;
  fstream fs;
  byte abStack_208 [496];
  
  std::__cxx11::string::string((string *)&filename,charfilename,(allocator *)&fs);
  std::fstream::fstream(&fs,(string *)&filename,_S_in);
  if ((abStack_208[*(long *)(_fs + -0x18)] & 5) == 0) {
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    while( true ) {
      piVar5 = std::istream::_M_extract<double>((double *)&fs);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<double,_std::allocator<double>_>::push_back(&v,&a);
    }
    std::fstream::close();
    ppVar4 = (particles *)operator_new(0x10);
    pdVar2 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar6 = (ulong)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) / 9;
    ppVar4->n = uVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x48),8) == 0) {
      uVar9 = SUB168(auVar1 * ZEXT816(0x48),0);
    }
    ppVar7 = (particle *)operator_new__(uVar9);
    ppVar4->p = ppVar7;
    lVar8 = 0x40;
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x40) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x40);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x38) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x38);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x30) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x30);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x28) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x28);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x20) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x20);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x18) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x18);
      *(undefined8 *)((long)ppVar7 + lVar8 + -0x10) = *(undefined8 *)((long)pdVar2 + lVar8 + -0x10);
      *(undefined8 *)((long)ppVar7 + lVar8 + -8) = *(undefined8 *)((long)pdVar2 + lVar8 + -8);
      *(undefined8 *)((long)&ppVar7->q + lVar8) = *(undefined8 *)((long)pdVar2 + lVar8);
      lVar8 = lVar8 + 0x48;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "libchameleon: read_particles: ERROR: no such file, ");
    poVar3 = std::operator<<(poVar3,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::fstream::close();
    ppVar4 = (particles *)operator_new(0x10);
    ppVar4->n = 0;
    ppVar4->p = (particle *)0x0;
  }
  std::fstream::~fstream(&fs);
  std::__cxx11::string::~string((string *)&filename);
  return ppVar4;
}

Assistant:

particles* read_particles(const char* charfilename) { // char* ptype?
    string filename(charfilename);
    fstream fs(filename, ios_base::in);
    if (fs) {
        double a;
        std::vector<double> v;
        while (fs >> a) {
            v.push_back(a);
        }
        fs.close();
        particles* p = new particles;
        p -> n = v.size() / 9;
        p -> p = new particle[p -> n];
        for (long i = 0; i < v.size() / 9; ++i) {
            (p -> p)[i].q = v[9 * i];
            (p -> p)[i].x = v[9 * i + 1];
            (p -> p)[i].y = v[9 * i + 2];
            (p -> p)[i].z = v[9 * i + 3];
            (p -> p)[i].ux = v[9 * i + 4];
            (p -> p)[i].uy = v[9 * i + 5];
            (p -> p)[i].uz = v[9 * i + 6];
            (p -> p)[i].g = v[9 * i + 7];
            (p -> p)[i].chi = v[9 * i + 8];
        }
        return p;
    } else {
        cerr << "libchameleon: read_particles: ERROR: no such file, " << filename <<
            endl;
        fs.close();
        particles* p = new particles;
        p -> n = 0;
        p -> p = nullptr;
        return p;
    }
}